

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp-rb.c
# Opt level: O3

int rtp_rb_insert_pkt(rtp_pkt_t *pkt,int idx)

{
  ulong uVar1;
  uint uVar2;
  
  if (pkt == (rtp_pkt_t *)0x0) {
    __assert_fail("pkt != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp-rb.c",0x5c,
                  "int rtp_rb_insert_pkt(rtp_pkt_t *, int)");
  }
  if (rtp_rb == (rtp_pkt_t *)0x0) {
    __assert_fail("rtp_rb != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp-rb.c",0x5d,
                  "int rtp_rb_insert_pkt(rtp_pkt_t *, int)");
  }
  if (idx < 0) {
    uVar2 = rtp_rb_length();
    if (rtp_rb_size < uVar2 - idx) {
      return 0;
    }
    rtp_rb_start = (idx + rtp_rb_start) % rtp_rb_size;
    idx = 0;
  }
  else if (rtp_rb_size - 1 <= (uint)idx) {
    return 0;
  }
  uVar1 = (ulong)(rtp_rb_start + idx) % (ulong)rtp_rb_size;
  if (rtp_rb[uVar1].length == 0) {
    memcpy(rtp_rb + uVar1,pkt,0x628);
    rtp_rb_cnt = rtp_rb_cnt + 1;
    uVar2 = rtp_rb_length();
    if (uVar2 <= (uint)idx) {
      rtp_rb_end = (idx + rtp_rb_start + 1) % rtp_rb_size;
    }
    if (rtp_rb_start == rtp_rb_end) {
      __assert_fail("rtp_rb_start != rtp_rb_end",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp-rb.c",0x80,
                    "int rtp_rb_insert_pkt(rtp_pkt_t *, int)");
    }
    if (rtp_rb[rtp_rb_end].length != 0) {
      __assert_fail("rtp_rb[rtp_rb_end].length == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp-rb.c",0x81,
                    "int rtp_rb_insert_pkt(rtp_pkt_t *, int)");
    }
    return 1;
  }
  __assert_fail("dstpkt->length == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp-rb.c",0x72,
                "int rtp_rb_insert_pkt(rtp_pkt_t *, int)");
}

Assistant:

int rtp_rb_insert_pkt(rtp_pkt_t *pkt, int idx) {
  assert(pkt != NULL);
  assert(rtp_rb != NULL);

#ifdef DEBUG
  fprintf(stderr, "insert packet at idx %d\n", idx);
#endif
  
  if (idx < 0) {
    /* try to grow the buffer downwards */
    if ((rtp_rb_length() - idx) <= rtp_rb_size) {
      rtp_rb_start = (rtp_rb_start + idx) % rtp_rb_size;
      idx = 0;
    } else
      /* drop the packet silently */
      return 0;
  } else if (idx >= rtp_rb_size - 1) {
    /* not enough place left in ring buffer */
    return 0;
  }


  rtp_pkt_t *dstpkt = rtp_rb + ((idx + rtp_rb_start) % rtp_rb_size);
  assert(dstpkt->length == 0);
  memcpy(dstpkt, pkt, sizeof(rtp_pkt_t));
  rtp_rb_cnt++;

#ifdef DEBUG
  fprintf(stderr, "packet inserted at %d, end: %d\n",
          (idx + rtp_rb_start) % rtp_rb_size,
          rtp_rb_end);
#endif
  
  /* adjust the end pointer */
  if (idx >= rtp_rb_length()) 
    rtp_rb_end = ((idx + rtp_rb_start + 1)% rtp_rb_size);

  assert(rtp_rb_start != rtp_rb_end);
  assert(rtp_rb[rtp_rb_end].length == 0);

  return 1;
}